

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetGlobals.cpp
# Opt level: O2

void __thiscall wasm::SetGlobals::run(SetGlobals *this,Module *module)

{
  uintptr_t uVar1;
  int iVar2;
  Global *pGVar3;
  Const *pCVar4;
  undefined1 input_00 [8];
  undefined1 local_2a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290 [23];
  Literal local_118;
  undefined1 local_100 [8];
  Name input;
  value_type value;
  undefined1 local_c0 [8];
  value_type name;
  undefined1 local_98 [8];
  Split pairs;
  Literal lit;
  undefined1 local_58 [8];
  Split nameAndValue;
  
  nameAndValue._24_8_ = module;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"set-globals",(allocator<char> *)local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"SetGlobals usage:  wasm-opt --pass-arg=set-globals@x=y,z=w",
             (allocator<char> *)&input.super_IString.str._M_str);
  Pass::getArgument((string *)local_2a0,&this->super_Pass,(string *)local_98,(string *)local_58);
  IString::IString((IString *)local_100,(string *)local_2a0);
  std::__cxx11::string::~string((string *)local_2a0);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_98);
  IString::toString_abi_cxx11_((string *)local_2a0,(IString *)local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,",",(allocator<char> *)local_c0);
  String::Split::Split((Split *)local_98,(string *)local_2a0,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_2a0);
  name.field_2._8_8_ =
       pairs.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  input_00 = local_98;
  while( true ) {
    if (input_00 == (undefined1  [8])name.field_2._8_8_) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2a0,"=",(allocator<char> *)local_c0);
    String::Split::Split((Split *)local_58,(string *)input_00,(string *)local_2a0);
    std::__cxx11::string::~string((string *)local_2a0);
    std::__cxx11::string::string((string *)local_c0,(string *)local_58);
    std::__cxx11::string::string
              ((string *)&input.super_IString.str._M_str,(string *)((long)local_58 + 0x20));
    IString::IString((IString *)((long)&value.field_2 + 8),(string *)local_c0);
    pGVar3 = Module::getGlobalOrNull((Module *)nameAndValue._24_8_,(Name)stack0xffffffffffffff30);
    if (pGVar3 == (Global *)0x0) break;
    pairs.needToHandleBracketingOperations = false;
    pairs._25_7_ = 0;
    uVar1 = (pGVar3->type).id;
    if (uVar1 == 3) {
      local_2a0._0_8_ =
           std::__cxx11::stoll((string *)&input.super_IString.str._M_str,(size_t *)0x0,10);
      local_290[0]._M_allocated_capacity = 3;
      Literal::operator=((Literal *)&pairs.needToHandleBracketingOperations,(Literal *)local_2a0);
    }
    else {
      if (uVar1 != 2) {
        Fatal::Fatal((Fatal *)local_2a0);
        std::operator<<((ostream *)(local_2a0 + 0x10),"global\'s type is not supported: ");
        Fatal::operator<<((Fatal *)local_2a0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c0);
        goto LAB_00b2537b;
      }
      iVar2 = std::__cxx11::stoi((string *)&input.super_IString.str._M_str,(size_t *)0x0,10);
      local_2a0._0_4_ = iVar2;
      local_290[0]._M_allocated_capacity = 2;
      Literal::operator=((Literal *)&pairs.needToHandleBracketingOperations,(Literal *)local_2a0);
    }
    Literal::~Literal((Literal *)local_2a0);
    local_2a0._0_8_ = nameAndValue._24_8_;
    Literal::Literal(&local_118,(Literal *)&pairs.needToHandleBracketingOperations);
    pCVar4 = Builder::makeConst((Builder *)local_2a0,&local_118);
    pGVar3->init = (Expression *)pCVar4;
    Literal::~Literal(&local_118);
    (pGVar3->super_Importable).base.super_IString.str._M_len = 0;
    (pGVar3->super_Importable).base.super_IString.str._M_str = (char *)0x0;
    (pGVar3->super_Importable).module.super_IString.str._M_len = 0;
    (pGVar3->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    Literal::~Literal((Literal *)&pairs.needToHandleBracketingOperations);
    std::__cxx11::string::~string((string *)&input.super_IString.str._M_str);
    std::__cxx11::string::~string((string *)local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
    input_00 = (undefined1  [8])((long)input_00 + 0x20);
  }
  Fatal::Fatal((Fatal *)local_2a0);
  std::operator<<((ostream *)(local_2a0 + 0x10),"Could not find global: ");
  Fatal::operator<<((Fatal *)local_2a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
LAB_00b2537b:
  Fatal::~Fatal((Fatal *)local_2a0);
}

Assistant:

void run(Module* module) override {
    Name input =
      getArgument("set-globals",
                  "SetGlobals usage:  wasm-opt --pass-arg=set-globals@x=y,z=w");

    // The input is a set of X=Y pairs separated by commas.
    String::Split pairs(input.toString(), ",");
    for (auto& pair : pairs) {
      String::Split nameAndValue(pair, "=");
      auto name = nameAndValue[0];
      auto value = nameAndValue[1];
      auto* glob = module->getGlobalOrNull(name);
      if (!glob) {
        Fatal() << "Could not find global: " << name;
      }
      // Parse the input.
      Literal lit;
      if (glob->type == Type::i32) {
        lit = Literal(int32_t(stoi(value)));
      } else if (glob->type == Type::i64) {
        lit = Literal(int64_t(stoll(value)));
      } else {
        Fatal() << "global's type is not supported: " << name;
      }
      // The global now has a value, and is not imported.
      glob->init = Builder(*module).makeConst(lit);
      glob->module = glob->base = Name();
    }
  }